

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

HEADER_HANDLE header_clone(HEADER_HANDLE value)

{
  AMQP_VALUE pAVar1;
  HEADER_HANDLE local_18;
  HEADER_INSTANCE *header_instance;
  HEADER_HANDLE value_local;
  
  local_18 = (HEADER_HANDLE)malloc(8);
  if (local_18 != (HEADER_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    local_18->composite_value = pAVar1;
    if (local_18->composite_value == (AMQP_VALUE)0x0) {
      free(local_18);
      local_18 = (HEADER_HANDLE)0x0;
    }
  }
  return local_18;
}

Assistant:

HEADER_HANDLE header_clone(HEADER_HANDLE value)
{
    HEADER_INSTANCE* header_instance = (HEADER_INSTANCE*)malloc(sizeof(HEADER_INSTANCE));
    if (header_instance != NULL)
    {
        header_instance->composite_value = amqpvalue_clone(((HEADER_INSTANCE*)value)->composite_value);
        if (header_instance->composite_value == NULL)
        {
            free(header_instance);
            header_instance = NULL;
        }
    }

    return header_instance;
}